

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

void lyds_split(lyd_node **first_sibling,lyd_node *leader,lyd_node *node,lyd_node **next_p)

{
  lyd_value_lyds_tree *_lt;
  lyd_meta *root_meta;
  lyd_node *dst;
  lyd_node *start;
  lyd_node *next;
  lyd_node *iter;
  rb_node *rbn;
  rb_node *rbt;
  lyd_node **next_p_local;
  lyd_node *node_local;
  lyd_node *leader_local;
  lyd_node **first_sibling_local;
  
  rbt = (rb_node *)next_p;
  next_p_local = (lyd_node **)node;
  node_local = leader;
  leader_local = (lyd_node *)first_sibling;
  if ((leader != (lyd_node *)0x0) && (node != (lyd_node *)0x0)) {
    rbn = lyds_get_rb_tree(leader,(lyd_meta **)&_lt);
    if ((rbn == (rb_node *)0x0) || (node_local == (lyd_node *)next_p_local)) {
      dst = next_p_local[3];
      lyd_unlink_ignore_lyds((lyd_node **)leader_local,(lyd_node *)next_p_local);
      root_meta = (lyd_meta *)next_p_local;
      next = dst;
      while ((next != (lyd_node *)0x0 &&
             (start = next->next, next->schema == (lysc_node *)next_p_local[1]))) {
        lyd_unlink_ignore_lyds((lyd_node **)leader_local,next);
        lyd_insert_after_node((lyd_node **)&next_p_local,(lyd_node *)root_meta,next);
        root_meta = (lyd_meta *)next;
        next = start;
      }
      rbt->parent = (rb_node *)next;
    }
    else {
      dst = next_p_local[3];
      if ((dst == (lyd_node *)0x0) || (dst->schema != (lysc_node *)next_p_local[1])) {
        rb_remove_node((lyd_meta *)_lt,&rbn,(lyd_node *)next_p_local,(rb_node **)&iter);
        rb_free_node((rb_node **)&iter);
        lyd_unlink_ignore_lyds((lyd_node **)leader_local,(lyd_node *)next_p_local);
        rbt->parent = (rb_node *)dst;
      }
      else {
        rb_remove_node((lyd_meta *)_lt,&rbn,(lyd_node *)next_p_local,(rb_node **)&iter);
        rb_free_node((rb_node **)&iter);
        lyd_unlink_ignore_lyds((lyd_node **)leader_local,(lyd_node *)next_p_local);
        root_meta = (lyd_meta *)next_p_local;
        next = dst;
        while ((next != (lyd_node *)0x0 &&
               (start = next->next, next->schema == (lysc_node *)next_p_local[1]))) {
          rb_remove_node((lyd_meta *)_lt,&rbn,next,(rb_node **)&iter);
          rb_free_node((rb_node **)&iter);
          lyd_unlink_ignore_lyds((lyd_node **)leader_local,next);
          lyd_insert_after_node((lyd_node **)&next_p_local,(lyd_node *)root_meta,next);
          root_meta = (lyd_meta *)next;
          next = start;
        }
        rbt->parent = (rb_node *)next;
      }
      _lt[6].rbt = rbn;
    }
    return;
  }
  __assert_fail("leader && node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x555,
                "void lyds_split(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lyd_node **)"
               );
}

Assistant:

void
lyds_split(struct lyd_node **first_sibling, struct lyd_node *leader, struct lyd_node *node, struct lyd_node **next_p)
{
    struct rb_node *rbt, *rbn;
    struct lyd_node *iter, *next, *start, *dst;
    struct lyd_meta *root_meta;

    assert(leader && node);

    rbt = lyds_get_rb_tree(leader, &root_meta);
    if (!rbt || (leader == node)) {
        /* Second list is just unlinked */
        start = node->next;
        lyd_unlink_ignore_lyds(first_sibling, node);
        dst = node;
        LY_LIST_FOR_SAFE(start, next, iter) {
            if (iter->schema != node->schema) {
                break;
            }
            lyd_unlink_ignore_lyds(first_sibling, iter);
            lyd_insert_after_node(&node, dst, iter);
            dst = iter;
        }
        *next_p = iter;
        return;
    }

    start = node->next;
    if (!start || (start->schema != node->schema)) {
        /* @p node is the last node, remove from Red-black tree and unlink */
        rb_remove_node(root_meta, &rbt, node, &rbn);
        rb_free_node(&rbn);
        lyd_unlink_ignore_lyds(first_sibling, node);
        *next_p = start;
        goto cleanup;
    }

    /* remove @p node from Red-black tree and unlink */
    rb_remove_node(root_meta, &rbt, node, &rbn);
    rb_free_node(&rbn);
    lyd_unlink_ignore_lyds(first_sibling, node);

    /* remove the rest of nodes from Red-black tree and unlink */
    dst = node;
    LY_LIST_FOR_SAFE(start, next, iter) {
        if (iter->schema != node->schema) {
            break;
        }
        rb_remove_node(root_meta, &rbt, iter, &rbn);
        rb_free_node(&rbn);
        lyd_unlink_ignore_lyds(first_sibling, iter);
        /* insert them to the second (leaf-)list */
        lyd_insert_after_node(&node, dst, iter);
        dst = iter;
    }
    *next_p = iter;

cleanup:
    RBT_SET(root_meta, rbt);
}